

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall
QMetaObjectBuilder::addMetaObject
          (QMetaObjectBuilder *this,QMetaObject *prototype,AddMembers members)

{
  StaticMetacallFunction p_Var1;
  uint index;
  int iVar2;
  MethodType MVar3;
  int iVar4;
  char *pcVar5;
  int __type;
  int __type_00;
  int __type_01;
  SuperData *pSVar6;
  long in_FS_OFFSET;
  char local_8c;
  uint local_88;
  QArrayDataPointer<char> local_80;
  QMetaClassInfo local_68;
  QMetaMethod local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 1) != 0) {
    pcVar5 = QMetaObject::className(prototype);
    QByteArray::operator=(&this->d->className,pcVar5);
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 2) != 0) {
    this->d->superClass = (prototype->d).superdata.direct;
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x1c) != 0) {
    index = QMetaObject::methodOffset(prototype);
    local_88 = (uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                     super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x1000;
    while( true ) {
      iVar2 = QMetaObject::methodCount(prototype);
      if (iVar2 <= (int)index) break;
      local_58.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      pcVar5 = (char *)(ulong)index;
      local_58 = QMetaObject::method(prototype,index);
      MVar3 = QMetaMethod::methodType(&local_58);
      if (MVar3 == Signal) {
LAB_002669c6:
        MVar3 = QMetaMethod::methodType(&local_58);
        if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                    super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 4) == 0) ||
           (MVar3 != Method)) {
          MVar3 = QMetaMethod::methodType(&local_58);
          if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                      super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 8) == 0) ||
             (MVar3 != Signal)) {
            MVar3 = QMetaMethod::methodType(&local_58);
            if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                        super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x10) == 0) ||
               (MVar3 != Slot)) goto LAB_00266a3b;
          }
        }
        addMethod(this,&local_58);
      }
      else {
        iVar2 = QMetaMethod::access(&local_58,pcVar5,__type);
        if (iVar2 != 2 ||
            ((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                   super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x800) != 0) {
          iVar2 = QMetaMethod::access(&local_58,pcVar5,__type_00);
          if (iVar2 != 0 ||
              ((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                     super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x2000) != 0) {
            iVar2 = QMetaMethod::access(&local_58,pcVar5,__type_01);
            if (iVar2 != 1 || local_88 != 0) goto LAB_002669c6;
          }
        }
      }
LAB_00266a3b:
      index = index + 1;
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x20) != 0) {
    iVar2 = 0;
    while( true ) {
      iVar4 = QMetaObject::constructorCount(prototype);
      if (iVar4 <= iVar2) break;
      local_58 = QMetaObject::constructor(prototype,iVar2);
      addConstructor(this,&local_58);
      iVar2 = iVar2 + 1;
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i & 0x40) != 0) {
    iVar2 = QMetaObject::propertyOffset(prototype);
    while( true ) {
      iVar4 = QMetaObject::propertyCount(prototype);
      if (iVar4 <= iVar2) break;
      QMetaObject::property((QMetaProperty *)&local_58,prototype,iVar2);
      addProperty(this,(QMetaProperty *)&local_58);
      iVar2 = iVar2 + 1;
    }
  }
  local_8c = (char)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
                   super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i;
  if (local_8c < '\0') {
    iVar2 = QMetaObject::enumeratorOffset(prototype);
    while( true ) {
      iVar4 = QMetaObject::enumeratorCount(prototype);
      if (iVar4 <= iVar2) break;
      local_58 = (QMetaMethod)QMetaObject::enumerator(prototype,iVar2);
      addEnumerator(this,(QMetaEnum *)&local_58);
      iVar2 = iVar2 + 1;
    }
  }
  if (((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
             super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 8 & 1) != 0) {
    iVar2 = QMetaObject::classInfoOffset(prototype);
    while( true ) {
      iVar4 = QMetaObject::classInfoCount(prototype);
      if (iVar4 <= iVar2) break;
      local_68.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QMetaObject::classInfo(prototype,iVar2);
      pcVar5 = QMetaClassInfo::name(&local_68);
      QByteArray::QByteArray((QByteArray *)&local_58,pcVar5,-1);
      pcVar5 = QMetaClassInfo::value(&local_68);
      QByteArray::QByteArray((QByteArray *)&local_80,pcVar5,-1);
      addClassInfo(this,(QByteArray *)&local_58,(QByteArray *)&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      iVar2 = iVar2 + 1;
    }
  }
  if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
              super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 9 & 1) != 0) &&
     (pSVar6 = (prototype->d).relatedMetaObjects, pSVar6 != (SuperData *)0x0)) {
    for (; pSVar6->direct != (QMetaObject *)0x0; pSVar6 = pSVar6 + 1) {
      addRelatedMetaObject(this,pSVar6->direct);
    }
  }
  if ((((uint)members.super_QFlagsStorageHelper<QMetaObjectBuilder::AddMember,_4>.
              super_QFlagsStorage<QMetaObjectBuilder::AddMember>.i >> 10 & 1) != 0) &&
     (p_Var1 = (prototype->d).static_metacall, p_Var1 != (StaticMetacallFunction)0x0)) {
    this->d->staticMetacallFunction = p_Var1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaObjectBuilder::addMetaObject(const QMetaObject *prototype,
                                       QMetaObjectBuilder::AddMembers members)
{
    Q_ASSERT(prototype);
    int index;

    if ((members & ClassName) != 0)
        d->className = prototype->className();

    if ((members & SuperClass) != 0)
        d->superClass = prototype->superClass();

    if ((members & (Methods | Signals | Slots)) != 0) {
        for (index = prototype->methodOffset(); index < prototype->methodCount(); ++index) {
            QMetaMethod method = prototype->method(index);
            if (method.methodType() != QMetaMethod::Signal) {
                if (method.access() == QMetaMethod::Public && (members & PublicMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Private && (members & PrivateMethods) == 0)
                    continue;
                if (method.access() == QMetaMethod::Protected && (members & ProtectedMethods) == 0)
                    continue;
            }
            if (method.methodType() == QMetaMethod::Method && (members & Methods) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Signal &&
                       (members & Signals) != 0) {
                addMethod(method);
            } else if (method.methodType() == QMetaMethod::Slot &&
                       (members & Slots) != 0) {
                addMethod(method);
            }
        }
    }

    if ((members & Constructors) != 0) {
        for (index = 0; index < prototype->constructorCount(); ++index)
            addConstructor(prototype->constructor(index));
    }

    if ((members & Properties) != 0) {
        for (index = prototype->propertyOffset(); index < prototype->propertyCount(); ++index)
            addProperty(prototype->property(index));
    }

    if ((members & Enumerators) != 0) {
        for (index = prototype->enumeratorOffset(); index < prototype->enumeratorCount(); ++index)
            addEnumerator(prototype->enumerator(index));
    }

    if ((members & ClassInfos) != 0) {
        for (index = prototype->classInfoOffset(); index < prototype->classInfoCount(); ++index) {
            QMetaClassInfo ci = prototype->classInfo(index);
            addClassInfo(ci.name(), ci.value());
        }
    }

    if ((members & RelatedMetaObjects) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 2);
        const auto *objects = prototype->d.relatedMetaObjects;
        if (objects) {
            while (*objects != nullptr) {
                addRelatedMetaObject(*objects);
                ++objects;
            }
        }
    }

    if ((members & StaticMetacall) != 0) {
        Q_ASSERT(qmobPriv(prototype->d.data)->revision >= 6);
        if (prototype->d.static_metacall)
            setStaticMetacallFunction(prototype->d.static_metacall);
    }
}